

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O2

int sexp_buffered_write_string_n(sexp ctx,char *str,sexp_uint_t len,sexp p)

{
  sexp *ppsVar1;
  sexp_uint_t sVar2;
  int iVar3;
  int iVar4;
  size_t __n;
  int iVar5;
  size_t sVar6;
  
  sVar6 = (p->value).port.size;
  iVar4 = 0;
  for (; sVar2 = (p->value).port.offset, sVar6 <= sVar2 + len; len = len - __n) {
    iVar5 = (int)sVar6 - (int)sVar2;
    __n = (size_t)iVar5;
    memcpy((void *)((long)&((p->value).type.setters)->tag + sVar2),str,__n);
    (p->value).type.print = (sexp)(p->value).port.size;
    iVar3 = sexp_buffered_flush(ctx,p,0);
    if (iVar3 != 0) goto LAB_00110d7b;
    sVar6 = (p->value).port.size;
    iVar4 = iVar4 + (int)sVar6;
    str = str + __n;
  }
  memcpy((void *)((long)&((p->value).type.setters)->tag + sVar2),str,len);
  ppsVar1 = &(p->value).type.print;
  *ppsVar1 = (sexp)((long)&(*ppsVar1)->tag + len);
  iVar5 = (int)len;
LAB_00110d7b:
  return iVar4 + iVar5;
}

Assistant:

int sexp_buffered_write_string_n (sexp ctx, const char *str,
                                  sexp_uint_t len, sexp p) {
  int diff, res, written=0;
  while (sexp_port_offset(p)+len >= sexp_port_size(p)) {
    diff = sexp_port_size(p) - sexp_port_offset(p);
    memcpy(sexp_port_buf(p)+sexp_port_offset(p), str, diff);
    sexp_port_offset(p) = sexp_port_size(p);
    if ((res = sexp_buffered_flush(ctx, p, 0)))
      return written + diff;
    written += sexp_port_size(p);
    str += diff;
    len -= diff;
  }
  memcpy(sexp_port_buf(p)+sexp_port_offset(p), str, len);
  sexp_port_offset(p) += len;
  return written + len;
}